

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.capnp.h
# Opt level: O0

void __thiscall
capnp::compiler::Expression::Builder::adoptTuple
          (Builder *this,
          Orphan<capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>_> *value)

{
  PointerBuilder builder;
  uint uVar1;
  Orphan<capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>_> *value_00;
  PointerBuilder local_30;
  Orphan<capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>_> *local_18;
  Orphan<capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>_> *value_local;
  Builder *this_local;
  
  local_18 = value;
  value_local = (Orphan<capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>_> *)this;
  uVar1 = bounded<0u>();
  capnp::_::StructBuilder::setDataField<capnp::compiler::Expression::Which>
            (&this->_builder,uVar1,TUPLE);
  uVar1 = bounded<0u>();
  capnp::_::StructBuilder::getPointerField(&local_30,&this->_builder,uVar1);
  value_00 = kj::mv<capnp::Orphan<capnp::List<capnp::compiler::Expression::Param,(capnp::Kind)3>>>
                       (local_18);
  builder.capTable = local_30.capTable;
  builder.segment = local_30.segment;
  builder.pointer = local_30.pointer;
  capnp::_::
  PointerHelpers<capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>,_(capnp::Kind)6>::
  adopt(builder,value_00);
  return;
}

Assistant:

inline void Expression::Builder::adoptTuple(
    ::capnp::Orphan< ::capnp::List< ::capnp::compiler::Expression::Param,  ::capnp::Kind::STRUCT>>&& value) {
  _builder.setDataField<Expression::Which>(
      ::capnp::bounded<0>() * ::capnp::ELEMENTS, Expression::TUPLE);
  ::capnp::_::PointerHelpers< ::capnp::List< ::capnp::compiler::Expression::Param,  ::capnp::Kind::STRUCT>>::adopt(_builder.getPointerField(
      ::capnp::bounded<0>() * ::capnp::POINTERS), kj::mv(value));
}